

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_0::GetProtocAbsolutePath(string *path)

{
  bool bVar1;
  ssize_t sVar2;
  char local_1018 [4];
  int len;
  char buffer [4096];
  string *path_local;
  
  buffer._4088_8_ = path;
  sVar2 = readlink("/proc/self/exe",local_1018,0x1000);
  bVar1 = 0 < (int)sVar2;
  if (bVar1) {
    std::__cxx11::string::assign((char *)buffer._4088_8_,(ulong)local_1018);
  }
  return bVar1;
}

Assistant:

bool GetProtocAbsolutePath(string* path) {
#ifdef _WIN32
  char buffer[MAX_PATH];
  int len = GetModuleFileNameA(NULL, buffer, MAX_PATH);
#elif __APPLE__
  char buffer[PATH_MAX];
  int len = 0;

  char dirtybuffer[PATH_MAX];
  uint32_t size = sizeof(dirtybuffer);
  if (_NSGetExecutablePath(dirtybuffer, &size) == 0) {
    realpath(dirtybuffer, buffer);
    len = strlen(buffer);
  }
#else
  char buffer[PATH_MAX];
  int len = readlink("/proc/self/exe", buffer, PATH_MAX);
#endif
  if (len > 0) {
    path->assign(buffer, len);
    return true;
  } else {
    return false;
  }
}